

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O3

shared_ptr<Expr> __thiscall Parser::join(Parser *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  Parser *in_RSI;
  shared_ptr<Expr> sVar4;
  shared_ptr<Token> tok;
  undefined1 local_69;
  shared_ptr<Token> local_68;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  sVar4 = equality(this);
  _Var3 = sVar4.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_68.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (in_RSI->look).super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((local_68.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->tag == 0x100) {
    do {
      local_68.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (in_RSI->look).super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (local_68.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_68.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_68.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                         ._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_68.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_68.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                         ._M_pi)->_M_use_count + 1;
        }
      }
      move(in_RSI);
      equality((Parser *)&stack0xffffffffffffffc0);
      std::__shared_ptr<And,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<And>,std::shared_ptr<Token>&,std::shared_ptr<Expr>&,std::shared_ptr<Expr>>
                ((__shared_ptr<And,(__gnu_cxx::_Lock_policy)2> *)&local_58,
                 (allocator<And> *)&local_69,&local_68,(shared_ptr<Expr> *)this,
                 (shared_ptr<Expr> *)&stack0xffffffffffffffc0);
      p_Var2 = p_Stack_50;
      peVar1 = local_58;
      local_58 = (element_type *)0x0;
      p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_00 = (this->top).super___shared_ptr<Env,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      (this->top).super___shared_ptr<Env,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
      (this->top).super___shared_ptr<Env,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var2;
      _Var3._M_pi = extraout_RDX;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        _Var3._M_pi = extraout_RDX_00;
        if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
          _Var3._M_pi = extraout_RDX_01;
        }
      }
      if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
        _Var3._M_pi = extraout_RDX_02;
      }
      if (local_68.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_68.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ;
        _Var3._M_pi = extraout_RDX_03;
      }
      local_68.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (in_RSI->look).super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    } while ((local_68.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->tag == 0x100);
  }
  sVar4.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  sVar4.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Expr>)sVar4.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Expr> join() {
		std::shared_ptr<Expr> x = equality();
		while (look->tag == AND) {
			std::shared_ptr<Token> tok = look; move();
			x = std::make_shared<And>(tok, x, equality());
		}
		return x;
	}